

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPFakeTransmitter::DeleteFromAcceptList(RTPFakeTransmitter *this,RTPAddress *addr)

{
  int iVar1;
  
  iVar1 = -0x84;
  if ((((this->init == true) && (iVar1 = -0x83, this->created == true)) &&
      (iVar1 = -0x7e, addr->addresstype == IPv4Address)) &&
     (iVar1 = -0x7c, this->receivemode == AcceptSome)) {
    iVar1 = ProcessDeleteAcceptIgnoreEntry
                      (this,*(uint32_t *)&addr->field_0xc,*(uint16_t *)&addr[1]._vptr_RTPAddress);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int RTPFakeTransmitter::DeleteFromAcceptList(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	int status;
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv4Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_INVALIDADDRESSTYPE;
	}
	if (receivemode != RTPTransmitter::AcceptSome)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_DIFFERENTRECEIVEMODE;
	}
	
	const RTPIPv4Address &address = (const RTPIPv4Address &)addr;
	status = ProcessDeleteAcceptIgnoreEntry(address.GetIP(),address.GetPort());

	MAINMUTEX_UNLOCK
	return status;
}